

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UnicodeString *src,int32_t srcStart,int32_t srcLength)

{
  char16_t *srcChars;
  int32_t local_18;
  int32_t local_14;
  
  if (srcLength != 0) {
    local_18 = srcLength;
    local_14 = srcStart;
    pinIndices(src,&local_14,&local_18);
    if (((src->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      srcChars = (src->fUnion).fFields.fArray;
    }
    else {
      srcChars = (src->fUnion).fStackFields.fBuffer;
    }
    this = doAppend(this,srcChars,local_14,local_18);
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UnicodeString& src, int32_t srcStart, int32_t srcLength) {
  if(srcLength == 0) {
    return *this;
  }

  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);
  return doAppend(src.getArrayStart(), srcStart, srcLength);
}